

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_global_unescape(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ushort uVar1;
  uint32_t c;
  JSValueUnion p_00;
  long lVar2;
  int iVar3;
  JSRefCountHeader *p;
  uint uVar4;
  int iVar5;
  int iVar6;
  JSValue v;
  StringBuffer local_50;
  
  v = JS_ToStringInternal(ctx,*argv,0);
  p_00 = v.u;
  if ((uint)v.tag != 6) {
    local_50.len = 0;
    local_50.size = 0;
    local_50.is_wide_char = 0;
    local_50.error_status = 0;
    local_50.ctx = ctx;
    local_50.str = js_alloc_string(ctx,0,0);
    if (local_50.str == (JSString *)0x0) {
      local_50._16_8_ = local_50._16_8_ & 0xffffffff;
      local_50.error_status = -1;
    }
    uVar4 = *(uint *)((long)p_00.ptr + 4) & 0x7fffffff;
    if (uVar4 != 0) {
      iVar6 = 0;
      do {
        lVar2 = (long)iVar6;
        iVar3 = (int)*(undefined8 *)((long)p_00.ptr + 4);
        if (iVar3 < 0) {
          c = (uint32_t)*(ushort *)((long)p_00.ptr + lVar2 * 2 + 0x10);
        }
        else {
          c = (uint32_t)*(byte *)((long)p_00.ptr + lVar2 + 0x10);
        }
        iVar5 = iVar6;
        if (c == 0x25) {
          if (iVar6 <= (int)(uVar4 - 6)) {
            if (iVar3 < 0) {
              uVar1 = *(ushort *)((long)p_00.ptr + lVar2 * 2 + 0x12);
            }
            else {
              uVar1 = (ushort)*(byte *)((long)p_00.ptr + lVar2 + 0x11);
            }
            if ((uVar1 == 0x75) &&
               (c = string_get_hex((JSString *)p_00.ptr,iVar6 + 2,4), -1 < (int)c)) {
              iVar5 = iVar6 + 5;
              goto LAB_00165be6;
            }
          }
          c = 0x25;
          if (iVar6 <= (int)(uVar4 - 3)) {
            c = string_get_hex((JSString *)p_00.ptr,iVar6 + 1,2);
            iVar5 = iVar6 + 2;
            if ((int)c < 0) {
              c = 0x25;
              iVar5 = iVar6;
            }
          }
        }
LAB_00165be6:
        string_buffer_putc16(&local_50,c);
        iVar6 = iVar5 + 1;
      } while (iVar6 < (int)uVar4);
    }
    if ((0xfffffff4 < (uint)v.tag) && (iVar6 = *p_00.ptr, *(int *)p_00.ptr = iVar6 + -1, iVar6 < 2))
    {
      __JS_FreeValueRT(ctx->rt,v);
    }
    v = string_buffer_end(&local_50);
  }
  return v;
}

Assistant:

static JSValue js_global_unescape(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int i, len, c, n;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        return str;

    string_buffer_init(ctx, b, 0);
    p = JS_VALUE_GET_STRING(str);
    for (i = 0, len = p->len; i < len; i++) {
        c = string_get(p, i);
        if (c == '%') {
            if (i + 6 <= len
            &&  string_get(p, i + 1) == 'u'
            &&  (n = string_get_hex(p, i + 2, 4)) >= 0) {
                c = n;
                i += 6 - 1;
            } else
            if (i + 3 <= len
            &&  (n = string_get_hex(p, i + 1, 2)) >= 0) {
                c = n;
                i += 3 - 1;
            }
        }
        string_buffer_putc16(b, c);
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);
}